

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lapi.c
# Opt level: O3

int lua_gettable(lua_State *L,int idx)

{
  StkId pTVar1;
  int iVar2;
  undefined4 uVar3;
  TValue *t;
  TValue *slot;
  
  t = index2addr(L,idx);
  if (t->tt_ == 0x45) {
    slot = luaH_get((Table *)(t->value_).gc,L->top + -1);
    if (slot->tt_ != 0) {
      pTVar1 = L->top;
      iVar2 = slot->tt_;
      uVar3 = *(undefined4 *)&slot->field_0xc;
      pTVar1[-1].value_ = slot->value_;
      pTVar1[-1].tt_ = iVar2;
      *(undefined4 *)&pTVar1[-1].field_0xc = uVar3;
      goto LAB_001053cc;
    }
  }
  else {
    slot = (TValue *)0x0;
  }
  luaV_finishget(L,t,L->top + -1,L->top + -1,slot);
LAB_001053cc:
  return L->top[-1].tt_ & 0xf;
}

Assistant:

LUA_API int lua_gettable (lua_State *L, int idx) {
  StkId t;
  lua_lock(L);
  t = index2addr(L, idx);
  luaV_gettable(L, t, L->top - 1, L->top - 1);
  lua_unlock(L);
  return ttnov(L->top - 1);
}